

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChExceptionArchive::ChExceptionArchive(ChExceptionArchive *this,string *swhat)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)swhat);
  ChException::ChException(&this->super_ChException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_ChException = &PTR__ChException_001588f8;
  return;
}

Assistant:

ChExceptionArchive(std::string swhat) : ChException(swhat){}